

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int dom_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  byte bVar1;
  bitmap_el_t *pbVar2;
  bitmap_t pVVar3;
  bitmap_el_t *pbVar4;
  MIR_context_t ctx;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 extraout_RAX;
  bitmap_t pVVar7;
  bitmap_t pVVar8;
  bb_t_conflict extraout_RDX;
  bb_t_conflict extraout_RDX_00;
  char *pcVar9;
  bitmap_t pVVar10;
  bitmap_t pVVar11;
  bitmap_t bm;
  ulong unaff_RBP;
  bitmap_t pVVar12;
  const_bitmap_t src;
  const_bitmap_t nb;
  const_bitmap_t nb_00;
  char *pcVar13;
  bitmap_el_t bVar14;
  ulong uVar15;
  size_t sVar16;
  size_t sVar17;
  bb_t_conflict pbVar18;
  ulong unaff_R12;
  ulong unaff_R13;
  ulong uVar19;
  in_edge_t_conflict peVar20;
  ulong uVar21;
  const_bitmap_t pVVar22;
  undefined8 uVar23;
  
  pVVar10 = gen_ctx->temp_bitmap;
  bitmap_copy(pVVar10,bb->dom_in);
  peVar20 = (bb->in_edges).head;
  pVVar7 = bb->dom_in;
  src = peVar20->src->dom_out;
  bitmap_copy(pVVar7,src);
  while (peVar20 = (peVar20->in_link).next, peVar20 != (in_edge_t)0x0) {
    src = bb->dom_in;
    pVVar7 = src;
    bitmap_and(src,src,peVar20->src->dom_out);
  }
  pVVar11 = bb->dom_in;
  if (pVVar11 == (bitmap_t)0x0) {
    dom_con_func_n_cold_2();
  }
  else if (pVVar10 != (bitmap_t)0x0) {
    uVar21 = pVVar11->els_num;
    uVar15 = pVVar10->els_num;
    pVVar7 = pVVar10;
    uVar19 = uVar15;
    if (uVar15 < uVar21) {
      pVVar7 = pVVar11;
      pVVar11 = pVVar10;
      uVar19 = uVar21;
      uVar21 = uVar15;
    }
    pbVar2 = pVVar7->varr;
    iVar5 = bcmp(pVVar11->varr,pbVar2,uVar21 * 8);
    iVar6 = 1;
    if (iVar5 == 0) {
      if (uVar21 < uVar19) {
        do {
          if (pbVar2[uVar21] != 0) {
            return 1;
          }
          uVar21 = uVar21 + 1;
        } while (uVar19 != uVar21);
      }
      iVar6 = 0;
    }
    return iVar6;
  }
  dom_con_func_n_cold_1();
  pVVar11 = (bitmap_t)pVVar7[3].size;
  if ((pVVar11 != (bitmap_t)0x0) && (pVVar11->varr != (bitmap_el_t *)0x0)) {
    pVVar11->els_num = 0;
    uVar21 = src->els_num;
    bitmap_expand(pVVar11,uVar21 + 1);
    pVVar11->varr[uVar21 >> 6] = pVVar11->varr[uVar21 >> 6] | 1L << (uVar21 & 0x3f);
    iVar5 = bitmap_ior((bitmap_t)src[6].els_num,(bitmap_t)src[5].varr,(bitmap_t)pVVar7[3].size);
    return iVar5;
  }
  dom_trans_func_cold_1();
  nb = src;
  bm = pVVar7;
  if (src == (const_bitmap_t)0x0) {
LAB_00167d17:
    bitmap_ior_cold_4();
LAB_00167d1c:
    src = pVVar11;
    pVVar7 = pVVar10;
    bitmap_ior_cold_3();
  }
  else {
    bb = extraout_RDX;
    if (extraout_RDX == (bb_t_conflict)0x0) goto LAB_00167d1c;
    unaff_R12 = src->els_num;
    unaff_R13 = extraout_RDX->index;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    nb = (const_bitmap_t)(unaff_RBP << 6);
    bitmap_expand(pVVar7,(size_t)nb);
    if (pVVar7 != (bitmap_t)0x0) {
      pbVar2 = pVVar7->varr;
      if (unaff_RBP == 0) {
        uVar21 = 0;
        iVar5 = 0;
      }
      else {
        nb = (const_bitmap_t)src->varr;
        bm = (bitmap_t)extraout_RDX->rpost;
        iVar5 = 0;
        uVar15 = 0;
        uVar21 = 0;
        do {
          if (uVar15 < unaff_R12) {
            sVar16 = (&nb->els_num)[uVar15];
          }
          else {
            sVar16 = 0;
          }
          if (uVar15 < unaff_R13) {
            sVar17 = (&bm->els_num)[uVar15];
          }
          else {
            sVar17 = 0;
          }
          bb = (bb_t_conflict)pbVar2[uVar15];
          pbVar18 = (bb_t_conflict)(sVar17 | sVar16);
          pbVar2[uVar15] = (bitmap_el_t)pbVar18;
          uVar15 = uVar15 + 1;
          if (pbVar18 != (bb_t_conflict)0x0) {
            uVar21 = uVar15;
          }
          if (bb != pbVar18) {
            iVar5 = 1;
          }
        } while (unaff_RBP != uVar15);
      }
      if ((pbVar2 != (bitmap_el_t *)0x0) && (uVar21 <= pVVar7->els_num)) {
        pVVar7->els_num = uVar21;
        return iVar5;
      }
      bitmap_ior_cold_1();
      pVVar10 = pVVar7;
      pVVar11 = src;
      goto LAB_00167d17;
    }
  }
  bitmap_ior_cold_2();
  pVVar11 = pVVar7;
  nb_00 = nb;
  pVVar10 = bm;
  pbVar18 = bb;
  pVVar22 = src;
  uVar23 = extraout_RAX;
  if (nb == (const_bitmap_t)0x0) {
LAB_00167ddf:
    bitmap_and_compl_cold_4();
  }
  else {
    pbVar18 = extraout_RDX_00;
    if (extraout_RDX_00 != (bb_t_conflict)0x0) {
      pVVar11 = (bitmap_t)nb->els_num;
      pVVar3 = (bitmap_t)extraout_RDX_00->index;
      pVVar12 = pVVar3;
      if (pVVar3 < pVVar11) {
        pVVar12 = pVVar11;
      }
      nb_00 = (const_bitmap_t)((long)pVVar12 << 6);
      bitmap_expand(bm,(size_t)nb_00);
      if (bm == (bitmap_t)0x0) goto LAB_00167de9;
      pbVar2 = bm->varr;
      if (pVVar12 == (bitmap_t)0x0) {
        pVVar8 = (bitmap_t)0x0;
      }
      else {
        pbVar4 = nb->varr;
        nb_00 = (const_bitmap_t)extraout_RDX_00->rpost;
        pVVar10 = (bitmap_t)0x0;
        pVVar8 = (bitmap_t)0x0;
        do {
          if (pVVar10 < pVVar11) {
            bVar14 = pbVar4[(long)pVVar10];
          }
          else {
            bVar14 = 0;
          }
          uVar21 = 0xffffffffffffffff;
          if (pVVar10 < pVVar3) {
            uVar21 = ~(&nb_00->els_num)[(long)pVVar10];
          }
          pbVar2[(long)pVVar10] = uVar21 & bVar14;
          pVVar10 = (bitmap_t)((long)&pVVar10->els_num + 1);
          if ((uVar21 & bVar14) != 0) {
            pVVar8 = pVVar10;
          }
        } while (pVVar12 != pVVar10);
      }
      if ((pbVar2 != (bitmap_el_t *)0x0) && (pVVar8 <= (bitmap_t)bm->els_num)) {
        bm->els_num = (size_t)pVVar8;
        return (int)pbVar2;
      }
      bitmap_and_compl_cold_1();
      pVVar11 = bm;
      pVVar22 = nb;
      goto LAB_00167ddf;
    }
  }
  nb = pVVar22;
  bm = pVVar11;
  bitmap_and_compl_cold_3();
LAB_00167de9:
  bitmap_and_compl_cold_2();
  if (((FILE *)pVVar10[1].els_num != (FILE *)0x0) && (1 < (int)pVVar10[1].size)) {
    ctx = (MIR_context_t)pVVar10->els_num;
    bVar1 = *(byte *)((long)&nb_00->size + 1);
    pcVar13 = "may/must alloca ";
    if ((bVar1 & 3) == 0) {
      pcVar13 = "must alloca";
    }
    pcVar9 = "";
    if (bVar1 != 0) {
      pcVar9 = pcVar13;
    }
    pcVar13 = "const val";
    if ((char)nb_00->size == '\0') {
      pcVar13 = "val";
    }
    fprintf((FILE *)pVVar10[1].els_num,"%s%s=%lld for insn %lu:",pcVar9,pcVar13,nb_00[1].els_num,
            (ulong)*(uint *)((long)&nb_00->size + 4),bm,pbVar18,nb,uVar23,pVVar7,unaff_R12,unaff_R13
            ,bb,src,unaff_RBP);
    MIR_output_insn(ctx,(FILE *)pVVar10[1].els_num,(MIR_insn_t_conflict)nb_00->els_num,
                    (MIR_func_t)pVVar10->varr[8],1);
    return extraout_EAX_00;
  }
  return extraout_EAX;
}

Assistant:

static int dom_con_func_n (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e, head;
  bitmap_t prev_dom_in = temp_bitmap;

  bitmap_copy (prev_dom_in, bb->dom_in);
  head = DLIST_HEAD (in_edge_t, bb->in_edges);
  bitmap_copy (bb->dom_in, head->src->dom_out);
  for (e = DLIST_NEXT (in_edge_t, head); e != NULL; e = DLIST_NEXT (in_edge_t, e))
    bitmap_and (bb->dom_in, bb->dom_in, e->src->dom_out); /* dom_in &= dom_out */
  return !bitmap_equal_p (bb->dom_in, prev_dom_in);
}